

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetLocalizedGMTPattern
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UBool param_3,int32_t *parsedLen)

{
  ushort uVar1;
  int iVar2;
  byte bVar3;
  int32_t iVar4;
  char16_t *pcVar5;
  int length;
  int length_00;
  int32_t iVar6;
  int local_3c;
  UnicodeString *local_38;
  
  uVar1 = (this->fGMTPatternPrefix).fUnion.fStackFields.fLengthAndFlags;
  if ((short)uVar1 < 0) {
    length_00 = (this->fGMTPatternPrefix).fUnion.fFields.fLength;
  }
  else {
    length_00 = (int)(short)uVar1 >> 5;
  }
  local_3c = length_00;
  if (length_00 < 1) {
LAB_001f7934:
    local_38 = text;
    iVar4 = parseOffsetFields(this,text,start + length_00,'\0',&local_3c);
    iVar2 = local_3c;
    if (local_3c != 0) {
      uVar1 = (this->fGMTPatternSuffix).fUnion.fStackFields.fLengthAndFlags;
      if ((short)uVar1 < 0) {
        length = (this->fGMTPatternSuffix).fUnion.fFields.fLength;
      }
      else {
        length = (int)(short)uVar1 >> 5;
      }
      if (0 < length) {
        if (((int)(short)uVar1 & 1U) == 0) {
          if ((uVar1 & 2) == 0) {
            pcVar5 = (this->fGMTPatternSuffix).fUnion.fFields.fArray;
          }
          else {
            pcVar5 = (this->fGMTPatternSuffix).fUnion.fStackFields.fBuffer;
          }
          bVar3 = UnicodeString::doCaseCompare
                            (local_38,start + length_00 + local_3c,length,pcVar5,0,length,0);
        }
        else {
          bVar3 = ~*(byte *)&local_38->fUnion & 1;
        }
        if (bVar3 != 0) goto LAB_001f79d4;
      }
      iVar6 = iVar2 + length_00 + length;
      goto LAB_001f79e4;
    }
  }
  else {
    if (((int)(short)uVar1 & 1U) == 0) {
      if ((uVar1 & 2) == 0) {
        pcVar5 = (this->fGMTPatternPrefix).fUnion.fFields.fArray;
      }
      else {
        pcVar5 = (this->fGMTPatternPrefix).fUnion.fStackFields.fBuffer;
      }
      bVar3 = UnicodeString::doCaseCompare(text,start,length_00,pcVar5,0,length_00,0);
    }
    else {
      bVar3 = ~*(byte *)&text->fUnion & 1;
    }
    iVar4 = 0;
    if (bVar3 == 0) goto LAB_001f7934;
  }
LAB_001f79d4:
  iVar6 = 0;
LAB_001f79e4:
  *parsedLen = iVar6;
  return iVar4;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetLocalizedGMTPattern(const UnicodeString& text, int32_t start, UBool /*isShort*/, int32_t& parsedLen) const {
    int32_t idx = start;
    int32_t offset = 0;
    UBool parsed = FALSE;

    do {
        // Prefix part
        int32_t len = fGMTPatternPrefix.length();
        if (len > 0 && text.caseCompare(idx, len, fGMTPatternPrefix, 0) != 0) {
            // prefix match failed
            break;
        }
        idx += len;

        // Offset part
        offset = parseOffsetFields(text, idx, FALSE, len);
        if (len == 0) {
            // offset field match failed
            break;
        }
        idx += len;

        len = fGMTPatternSuffix.length();
        if (len > 0 && text.caseCompare(idx, len, fGMTPatternSuffix, 0) != 0) {
            // no suffix match
            break;
        }
        idx += len;
        parsed = TRUE;
    } while (FALSE);

    parsedLen = parsed ? idx - start : 0;
    return offset;
}